

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O2

bool __thiscall
cmFindProgramHelper::CheckDirectoryForName(cmFindProgramHelper *this,string *path,string *name)

{
  string *filename;
  pointer pbVar1;
  bool bVar2;
  pointer pbVar3;
  string local_50;
  
  pbVar3 = (this->Extensions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  filename = &this->TestPath;
  do {
    pbVar1 = (this->Extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar3 == pbVar1) {
LAB_002c7e3e:
      return pbVar3 != pbVar1;
    }
    std::__cxx11::string::_M_assign((string *)filename);
    std::__cxx11::string::append((string *)filename);
    if (pbVar3->_M_string_length == 0) {
LAB_002c7df7:
      std::__cxx11::string::append((string *)filename);
      bVar2 = cmsys::SystemTools::FileExists(filename,true);
      if (bVar2) {
        cmsys::SystemTools::CollapseFullPath(&local_50,filename);
        std::__cxx11::string::operator=((string *)&this->BestPath,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        goto LAB_002c7e3e;
      }
    }
    else {
      bVar2 = cmsys::SystemTools::StringEndsWith(name,(pbVar3->_M_dataplus)._M_p);
      if (!bVar2) goto LAB_002c7df7;
    }
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

bool CheckDirectoryForName(std::string const& path, std::string const& name)
    {
    for (std::vector<std::string>::iterator ext = this->Extensions.begin();
         ext != this->Extensions.end(); ++ext)
      {
      this->TestPath = path;
      this->TestPath += name;
      if (!ext->empty() && cmSystemTools::StringEndsWith(name, ext->c_str()))
        {
        continue;
        }
      this->TestPath += *ext;
      if (cmSystemTools::FileExists(this->TestPath, true))
        {
        this->BestPath = cmSystemTools::CollapseFullPath(this->TestPath);
        return true;
        }
      }
    return false;
    }